

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall sznet::net::TcpClient::~TcpClient(TcpClient *this)

{
  MutexLock *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *pEVar2;
  self *psVar3;
  bool bVar4;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_10a8 [8];
  MutexLockGuard lock;
  _Tuple_impl<0UL,_std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
  local_1098 [84];
  undefined1 local_d8 [12];
  code *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [12];
  undefined1 local_a8 [8];
  CloseCallback cb;
  TimerCallback local_68;
  undefined1 auStack_48 [8];
  TcpConnectionPtr conn;
  
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_d8,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_d8._0_8_;
    file.m_size = local_d8._8_4_;
    Logger::Logger((Logger *)local_10a8,file,0x3d);
    psVar3 = LogStream::operator<<((LogStream *)&lock,"TcpClient::~TcpClient[");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    psVar3 = LogStream::operator<<(psVar3,"] - connector ");
    LogStream::operator<<
              (psVar3,(this->m_connector).
                      super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_10a8);
  }
  this_00 = &this->m_mutex;
  auStack_48 = (undefined1  [8])0x0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_10a8 = (undefined1  [8])this_00;
  MutexLock::lock(this_00);
  p_Var1 = (this->m_connection).
           super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = p_Var1->_M_use_count == 1;
  }
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)auStack_48,
             &(this->m_connection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)local_10a8);
  if (auStack_48 == (undefined1  [8])0x0) {
    if (g_logLevel < 3) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_b8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_b8._0_8_;
      file_00.m_size = local_b8._8_4_;
      Logger::Logger((Logger *)local_10a8,file_00,0x58);
      LogStream::operator<<((LogStream *)&lock,"m_connection release!!!");
      Logger::~Logger((Logger *)local_10a8);
    }
    Connector::stop((this->m_connector).
                    super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar2 = this->m_loop;
    local_10a8 = (undefined1  [8])detail::removeConnector;
    std::__shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2> *)&lock,
               &(this->m_connector).
                super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<sznet::net::Connector>))(std::shared_ptr<sznet::net::Connector>const&)>,void>
              ((function<void()> *)&local_68,
               (_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>
                *)local_10a8);
    EventLoop::runAfter(pEVar2,1.0,&local_68);
    std::_Function_base::~_Function_base(&local_68.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1098);
  }
  else {
    lock.m_mutex = (MutexLock *)this->m_loop;
    if ((EventLoop *)lock.m_mutex != *(EventLoop **)((long)auStack_48 + 0x10)) {
      __assert_fail("m_loop == conn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                    ,0x4a,"sznet::net::TcpClient::~TcpClient()");
    }
    local_10a8 = (undefined1  [8])detail::removeConnection;
    std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)local_a8,
               (_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>
                *)local_10a8);
    pEVar2 = this->m_loop;
    local_c8 = TcpConnection::setCloseCallback;
    local_c0 = 0;
    std::
    _Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>
    ::
    _Bind<std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&>
              ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>
                *)local_10a8,(offset_in_TcpConnection_to_subr *)&local_c8,
               (shared_ptr<sznet::net::TcpConnection> *)auStack_48,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_a8);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&cb._M_invoker,
               (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>
                *)local_10a8);
    EventLoop::runInLoop(pEVar2,(Functor *)&cb._M_invoker);
    std::_Function_base::~_Function_base((_Function_base *)&cb._M_invoker);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
    ::~_Tuple_impl(local_1098);
    if (bVar4) {
      TcpConnection::forceClose((TcpConnection *)auStack_48);
    }
    std::_Function_base::~_Function_base((_Function_base *)local_a8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_connection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  MutexLock::~MutexLock(this_00);
  std::_Function_base::~_Function_base(&(this->m_writeCompleteCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_messageCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_connectionCallback).super__Function_base);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_connector).
              super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TcpClient::~TcpClient()
{
	LOG_INFO << "TcpClient::~TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
	TcpConnectionPtr conn;
	// TCP�����Ƿ���TcpClient(owner)���Գ���
	bool unique = false;
	{
		MutexLockGuard lock(m_mutex);
		unique = m_connection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		conn = m_connection;
	}
	if (conn)
	{
		assert(m_loop == conn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, conn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (unique)
		{
			conn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_connection release!!!";
		m_connector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeConnector, m_connector));
	}
}